

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaSimBase.c
# Opt level: O3

int Gia_SimRsbResubVerify(Gia_SimRsbMan_t *p,int iObj,Vec_Int_t *vFanins)

{
  word *__ptr;
  word *__ptr_00;
  long lVar1;
  int iVar2;
  
  __ptr = Gia_SimRsbFunc(p,iObj,p->vFanins,0);
  iVar2 = 1;
  __ptr_00 = Gia_SimRsbFunc(p,iObj,p->vFanins,1);
  if ((long)p->nWords < 1) {
    if (__ptr == (word *)0x0) goto LAB_007d3d31;
  }
  else {
    lVar1 = 0;
    do {
      if ((__ptr[lVar1] & __ptr_00[lVar1]) != 0) {
        iVar2 = 0;
        break;
      }
      lVar1 = lVar1 + 1;
    } while (p->nWords != lVar1);
  }
  free(__ptr);
LAB_007d3d31:
  if (__ptr_00 != (word *)0x0) {
    free(__ptr_00);
  }
  return iVar2;
}

Assistant:

int Gia_SimRsbResubVerify( Gia_SimRsbMan_t * p, int iObj, Vec_Int_t * vFanins )
{
    word * pTruth0 = Gia_SimRsbFunc( p, iObj, p->vFanins, 0 );
    word * pTruth1 = Gia_SimRsbFunc( p, iObj, p->vFanins, 1 );
    int Res = !Abc_TtIntersect( pTruth0, pTruth1, p->nWords, 0 );
    ABC_FREE( pTruth0 );
    ABC_FREE( pTruth1 );
    return Res;
}